

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::GBAtypeParameters> *this)

{
  GenericData::~GenericData(&this->super_GenericData);
  operator_delete(this,0x58);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}